

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

int secp256k1_scalar_cond_negate(secp256k1_scalar *r,int flag)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int vflag;
  
  lVar11 = (long)flag;
  iVar5 = secp256k1_scalar_is_zero(r);
  uVar10 = (ulong)(iVar5 + -1);
  secp256k1_scalar_verify(r);
  uVar6 = -lVar11;
  uVar7 = r->d[0] ^ uVar6;
  uVar8 = r->d[1] ^ uVar6;
  uVar9 = r->d[2] ^ uVar6;
  uVar1 = r->d[3];
  uVar2 = (ulong)CARRY8(uVar6 & 0xbfd25e8cd0364142,uVar7);
  uVar3 = (uVar6 & 0xbaaedce6af48a03b) + uVar8;
  uVar8 = (ulong)(CARRY8(uVar6 & 0xbaaedce6af48a03b,uVar8) || CARRY8(uVar3,uVar2));
  uVar4 = (uVar6 & 0xfffffffffffffffe) + uVar9;
  r->d[0] = (uVar6 & 0xbfd25e8cd0364142) + uVar7 & uVar10;
  r->d[1] = uVar3 + uVar2 & uVar10;
  r->d[2] = uVar4 + uVar8 & uVar10;
  r->d[3] = ((uVar6 ^ uVar1) - lVar11) +
            (ulong)(CARRY8(uVar6 & 0xfffffffffffffffe,uVar9) || CARRY8(uVar4,uVar8)) & uVar10;
  secp256k1_scalar_verify(r);
  return -(uint)(lVar11 != 0) | 1;
}

Assistant:

static int secp256k1_scalar_cond_negate(secp256k1_scalar *r, int flag) {
    /* If we are flag = 0, mask = 00...00 and this is a no-op;
     * if we are flag = 1, mask = 11...11 and this is identical to secp256k1_scalar_negate */
    volatile int vflag = flag;
    uint64_t mask = -vflag;
    uint64_t nonzero = (secp256k1_scalar_is_zero(r) != 0) - 1;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(r);

    secp256k1_u128_from_u64(&t, r->d[0] ^ mask);
    secp256k1_u128_accum_u64(&t, (SECP256K1_N_0 + 1) & mask);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1 & mask);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2 & mask);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3 & mask);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;

    SECP256K1_SCALAR_VERIFY(r);
    return 2 * (mask == 0) - 1;
}